

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

long duckdb::BinaryLambdaWrapper::
     Operation<duckdb::MismatchesFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
               (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
               idx_t idx)

{
  long lVar1;
  InvalidInputException *pIVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  allocator local_59;
  string local_58;
  undefined8 local_38;
  long local_30;
  undefined8 local_28;
  long local_20;
  
  local_38 = left.value._8_8_;
  local_28 = fun.result;
  local_20 = left.value._0_8_;
  local_30 = right.value._0_8_;
  uVar5 = (uint)fun.result;
  if (uVar5 != left.value._8_4_) {
    pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_58,"Mismatch Function: Strings must be of equal length!",&local_59);
    InvalidInputException::InvalidInputException(pIVar2,&local_58);
    __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (uVar5 != 0) {
    lVar4 = left.value._0_8_;
    if (uVar5 < 0xd) {
      lVar4 = (long)&local_28 + 4;
    }
    lVar3 = right.value._0_8_;
    if (uVar5 < 0xd) {
      lVar3 = (long)&local_38 + 4;
    }
    lVar1 = 0;
    for (uVar6 = 0; ((ulong)fun.result & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
      lVar1 = lVar1 + (ulong)(*(char *)(lVar4 + uVar6) != *(char *)(lVar3 + uVar6));
    }
    return lVar1;
  }
  pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,"Mismatch Function: Strings must be of length > 0!",&local_59);
  InvalidInputException::InvalidInputException(pIVar2,&local_58);
  __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}